

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O1

void asm_guardcc(ASMState *as,int cc)

{
  MCode *pMVar1;
  MCode *p;
  MCode *pMVar2;
  long lVar3;
  byte bVar4;
  
  bVar4 = (byte)cc;
  pMVar1 = as->mcp;
  pMVar2 = as->J->exitstubgroup[as->snapno >> 5] + ((as->snapno & 0x1f) << 2);
  if (pMVar1 == as->invmcp) {
    as->loopinv = 1;
    *(int *)(pMVar1 + 1) = ((int)pMVar2 - (int)pMVar1) + -5;
    bVar4 = bVar4 ^ 1;
    pMVar2 = pMVar1;
    if (as->realign != (MCode *)0x0) {
      if ((as->mrm).base == '%') {
        (as->mrm).ofs = (as->mrm).ofs + 2;
      }
      pMVar1[-1] = '\0';
      bVar4 = bVar4 & 0xf | 0x70;
      lVar3 = -2;
      goto LAB_0013f100;
    }
  }
  if ((as->mrm).base == '%') {
    (as->mrm).ofs = (as->mrm).ofs + 6;
  }
  *(int *)(pMVar1 + -4) = (int)pMVar2 - (int)pMVar1;
  pMVar1[-5] = bVar4 & 0xf | 0x80;
  bVar4 = 0xf;
  lVar3 = -6;
LAB_0013f100:
  pMVar1[lVar3] = bVar4;
  as->mcp = pMVar1 + lVar3;
  return;
}

Assistant:

static void asm_guardcc(ASMState *as, int cc)
{
  MCode *target = exitstub_addr(as->J, as->snapno);
  MCode *p = as->mcp;
  if (LJ_UNLIKELY(p == as->invmcp)) {
    as->loopinv = 1;
    *(int32_t *)(p+1) = jmprel(as->J, p+5, target);
    target = p;
    cc ^= 1;
    if (as->realign) {
      if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
	as->mrm.ofs += 2;  /* Fixup RIP offset for pending fused load. */
      emit_sjcc(as, cc, target);
      return;
    }
  }
  if (LJ_GC64 && LJ_UNLIKELY(as->mrm.base == RID_RIP))
    as->mrm.ofs += 6;  /* Fixup RIP offset for pending fused load. */
  emit_jcc(as, cc, target);
}